

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viterbi.cpp
# Opt level: O2

int __thiscall MeCab::Viterbi::open(Viterbi *this,char *__file,int __oflag,...)

{
  Tokenizer<mecab_node_t,_mecab_path_t> *pTVar1;
  Connector *pCVar2;
  int iVar3;
  int iVar4;
  Tokenizer<mecab_node_t,_mecab_path_t> *this_00;
  DictionaryInfo *pDVar5;
  Connector *this_01;
  ostream *poVar6;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  char *pcVar7;
  whatlog *this_02;
  wlog local_20;
  
  this_00 = (Tokenizer<mecab_node_t,_mecab_path_t> *)operator_new(0x678);
  Tokenizer<mecab_node_t,_mecab_path_t>::Tokenizer(this_00);
  pTVar1 = (this->tokenizer_).ptr_;
  iVar3 = extraout_EDX;
  if (pTVar1 != (Tokenizer<mecab_node_t,_mecab_path_t> *)0x0) {
    (*pTVar1->_vptr_Tokenizer[1])();
    iVar3 = extraout_EDX_00;
  }
  (this->tokenizer_).ptr_ = this_00;
  iVar3 = Tokenizer<mecab_node_t,_mecab_path_t>::open(this_00,__file,iVar3);
  if ((char)iVar3 == '\0') {
    wlog::wlog(&local_20,&this->what_);
    poVar6 = std::operator<<((ostream *)&this->what_,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/viterbi.cpp"
                            );
    poVar6 = std::operator<<(poVar6,"(");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x32);
    poVar6 = std::operator<<(poVar6,") [");
    poVar6 = std::operator<<(poVar6,"tokenizer_->open(param)");
    poVar6 = std::operator<<(poVar6,"] ");
    this_02 = &((this->tokenizer_).ptr_)->what_;
  }
  else {
    pDVar5 = Tokenizer<mecab_node_t,_mecab_path_t>::dictionary_info((this->tokenizer_).ptr_);
    if (pDVar5 == (DictionaryInfo *)0x0) {
      wlog::wlog(&local_20,&this->what_);
      poVar6 = std::operator<<((ostream *)&this->what_,
                               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/viterbi.cpp"
                              );
      poVar6 = std::operator<<(poVar6,"(");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x33);
      poVar6 = std::operator<<(poVar6,") [");
      poVar6 = std::operator<<(poVar6,"tokenizer_->dictionary_info()");
      poVar6 = std::operator<<(poVar6,"] ");
      pcVar7 = "Dictionary is empty";
      goto LAB_00122787;
    }
    this_01 = (Connector *)operator_new(0x1c0);
    Connector::Connector(this_01);
    pCVar2 = (this->connector_).ptr_;
    iVar3 = extraout_EDX_01;
    if (pCVar2 != (Connector *)0x0) {
      (*pCVar2->_vptr_Connector[1])();
      iVar3 = extraout_EDX_02;
    }
    (this->connector_).ptr_ = this_01;
    iVar3 = Connector::open(this_01,__file,iVar3);
    if ((char)iVar3 != '\0') {
      pDVar5 = Tokenizer<mecab_node_t,_mecab_path_t>::dictionary_info((this->tokenizer_).ptr_);
      if ((pDVar5->lsize == (uint)((this->connector_).ptr_)->lsize_) &&
         (pDVar5 = Tokenizer<mecab_node_t,_mecab_path_t>::dictionary_info((this->tokenizer_).ptr_),
         pDVar5->rsize == (uint)((this->connector_).ptr_)->rsize_)) {
        iVar4 = Param::get<int>((Param *)__file,"cost-factor");
        iVar3 = 800;
        if (iVar4 != 0) {
          iVar3 = iVar4;
        }
        this->cost_factor_ = iVar3;
        return (int)CONCAT71((uint7)(uint3)((uint)iVar4 >> 8),1);
      }
      wlog::wlog(&local_20,&this->what_);
      poVar6 = std::operator<<((ostream *)&this->what_,
                               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/viterbi.cpp"
                              );
      poVar6 = std::operator<<(poVar6,"(");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x3b);
      poVar6 = std::operator<<(poVar6,") [");
      poVar6 = std::operator<<(poVar6,
                               "tokenizer_->dictionary_info()->lsize == connector_->left_size() && tokenizer_->dictionary_info()->rsize == connector_->right_size()"
                              );
      poVar6 = std::operator<<(poVar6,"] ");
      pcVar7 = "Transition table and dictionary are not compatible";
      goto LAB_00122787;
    }
    wlog::wlog(&local_20,&this->what_);
    poVar6 = std::operator<<((ostream *)&this->what_,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/viterbi.cpp"
                            );
    poVar6 = std::operator<<(poVar6,"(");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x36);
    poVar6 = std::operator<<(poVar6,") [");
    poVar6 = std::operator<<(poVar6,"connector_->open(param)");
    poVar6 = std::operator<<(poVar6,"] ");
    this_02 = &((this->connector_).ptr_)->what_;
  }
  pcVar7 = whatlog::str(this_02);
LAB_00122787:
  std::operator<<(poVar6,pcVar7);
  return 0;
}

Assistant:

bool Viterbi::open(const Param &param) {
  tokenizer_.reset(new Tokenizer<Node, Path>);
  CHECK_FALSE(tokenizer_->open(param)) << tokenizer_->what();
  CHECK_FALSE(tokenizer_->dictionary_info()) << "Dictionary is empty";

  connector_.reset(new Connector);
  CHECK_FALSE(connector_->open(param)) << connector_->what();

  CHECK_FALSE(tokenizer_->dictionary_info()->lsize ==
              connector_->left_size() &&
              tokenizer_->dictionary_info()->rsize ==
              connector_->right_size())
      << "Transition table and dictionary are not compatible";

  cost_factor_ = param.get<int>("cost-factor");
  if (cost_factor_ == 0) {
    cost_factor_ = 800;
  }

  return true;
}